

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asio_service_test.cxx
# Opt level: O3

string * __thiscall
asio_service_test::test_write_empty_meta_abi_cxx11_
          (string *__return_storage_ptr__,asio_service_test *this,atomic<unsigned_long> *count,
          meta_cb_params *params)

{
  if (this != (asio_service_test *)0x0) {
    LOCK();
    *(long *)this = *(long *)this + 1;
    UNLOCK();
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  return __return_storage_ptr__;
}

Assistant:

std::string test_write_empty_meta( std::atomic<size_t>* count,
                                   const asio_service::meta_cb_params& params )
{
    if (count) (*count)++;
    return std::string();
}